

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QREncoder.cpp
# Opt level: O0

Version * ZXing::QRCode::ChooseVersion(int numInputBits,ErrorCorrectionLevel ecLevel)

{
  bool bVar1;
  Version *version_00;
  invalid_argument *this;
  Version *version;
  int versionNum;
  int in_stack_000012ac;
  ErrorCorrectionLevel in_stack_ffffffffffffffe4;
  int numInputBits_00;
  
  numInputBits_00 = 1;
  while( true ) {
    if (0x28 < numInputBits_00) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Data too big");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    version_00 = Version::Model2(in_stack_000012ac);
    bVar1 = WillFit(numInputBits_00,version_00,in_stack_ffffffffffffffe4);
    if (bVar1) break;
    numInputBits_00 = numInputBits_00 + 1;
  }
  return version_00;
}

Assistant:

static const Version& ChooseVersion(int numInputBits, ErrorCorrectionLevel ecLevel)
{
	for (int versionNum = 1; versionNum <= 40; versionNum++) {
		const Version* version = Version::Model2(versionNum);
		if (WillFit(numInputBits, *version, ecLevel)) {
			return *version;
		}
	}
	throw std::invalid_argument("Data too big");
}